

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ocsp.cc
# Opt level: O3

bool bssl::anon_unknown_20::VerifyOCSPResponseSignature
               (OCSPResponse *response,OCSPResponseData *response_data,
               ParsedCertificate *issuer_certificate)

{
  pointer pIVar1;
  _Optional_payload_base<bssl::SignatureAlgorithm> _Var2;
  Span<const_unsigned_char> *pSVar3;
  ParsedCertificate *pPVar4;
  bool bVar5;
  char cVar6;
  pointer pIVar7;
  Input *key_purpose_oid;
  Span<const_unsigned_char> *pSVar8;
  string_view der;
  Input rhs;
  shared_ptr<const_bssl::ParsedCertificate> cur_responder_certificate;
  ParsedCertificate *local_50;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  BitString *local_40;
  OCSPResponse *local_38;
  
  bVar5 = CheckResponderIDMatchesCertificate(&response_data->responder_id,issuer_certificate);
  if ((bVar5) &&
     (bVar5 = VerifySignedData(response->signature_algorithm,(Input)(response->data).data_,
                               &response->signature,(Input)(issuer_certificate->tbs_).spki_tlv.data_
                               ,(SignatureVerifyCache *)0x0), bVar5)) {
    return true;
  }
  pIVar7 = (response->certs).super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pIVar1 = (response->certs).super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pIVar7 != pIVar1) {
    local_40 = &response->signature;
    local_38 = response;
    do {
      der._M_str = (char *)(pIVar7->data_).size_;
      der._M_len = (size_t)&local_50;
      OCSPParseCertificate(der);
      cVar6 = '\x03';
      if ((((local_50 != (ParsedCertificate *)0x0) &&
           (bVar5 = CheckResponderIDMatchesCertificate(&response_data->responder_id,local_50),
           pPVar4 = local_50, bVar5)) &&
          (_Var2 = (local_50->signature_algorithm_).
                   super__Optional_base<bssl::SignatureAlgorithm,_true,_true>._M_payload.
                   super__Optional_payload_base<bssl::SignatureAlgorithm>,
          ((ulong)_Var2 >> 0x20 & 1) != 0)) &&
         ((bVar5 = VerifySignedData(_Var2._M_payload._M_value,
                                    (Input)(local_50->tbs_certificate_tlv_).data_,
                                    &local_50->signature_value_,
                                    (Input)(issuer_certificate->tbs_).spki_tlv.data_,
                                    (SignatureVerifyCache *)0x0), bVar5 &&
          (pPVar4->has_extended_key_usage_ == true)))) {
        pSVar3 = &((pPVar4->extended_key_usage_).
                   super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>._M_impl.
                   super__Vector_impl_data._M_finish)->data_;
        for (pSVar8 = &((pPVar4->extended_key_usage_).
                        super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>.
                        _M_impl.super__Vector_impl_data._M_start)->data_; pSVar8 != pSVar3;
            pSVar8 = pSVar8 + 1) {
          rhs.data_.size_ = 8;
          rhs.data_.data_ = "+\x06\x01\x05\x05\a\x03\tSerial number is not a valid INTEGER";
          bVar5 = bssl::der::operator==((Input)*pSVar8,rhs);
          if (bVar5) {
            cVar6 = VerifySignedData(local_38->signature_algorithm,(Input)(local_38->data).data_,
                                     local_40,(Input)(local_50->tbs_).spki_tlv.data_,
                                     (SignatureVerifyCache *)0x0);
            break;
          }
        }
      }
      if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48);
      }
      if ((cVar6 != '\x03') && (cVar6 != '\0')) {
        return true;
      }
      pIVar7 = pIVar7 + 1;
    } while (pIVar7 != pIVar1);
  }
  return false;
}

Assistant:

[[nodiscard]] bool VerifyOCSPResponseSignature(
    const OCSPResponse &response, const OCSPResponseData &response_data,
    const ParsedCertificate *issuer_certificate) {
  // In order to verify the OCSP signature, a valid responder matching the OCSP
  // Responder ID must be located (RFC 6960, 4.2.2.2). The responder is allowed
  // to be either the certificate issuer or a delegated authority directly
  // signed by the issuer.
  if (CheckResponderIDMatchesCertificate(response_data.responder_id,
                                         issuer_certificate) &&
      VerifyOCSPResponseSignatureGivenCert(response, issuer_certificate)) {
    return true;
  }

  // Otherwise search through the provided certificates for the Authorized
  // Responder. Want a certificate that:
  //  (1) Matches the OCSP Responder ID.
  //  (2) Has been given authority for OCSP signing by |issuer_certificate|.
  //  (3) Has signed the OCSP response using its public key.
  for (const auto &responder_cert_tlv : response.certs) {
    std::shared_ptr<const ParsedCertificate> cur_responder_certificate =
        OCSPParseCertificate(BytesAsStringView(responder_cert_tlv));

    // If failed parsing the certificate, keep looking.
    if (!cur_responder_certificate) {
      continue;
    }

    // If the certificate doesn't match the OCSP's responder ID, keep looking.
    if (!CheckResponderIDMatchesCertificate(response_data.responder_id,
                                            cur_responder_certificate.get())) {
      continue;
    }

    // If the certificate isn't a valid Authorized Responder certificate, keep
    // looking.
    if (!VerifyAuthorizedResponderCert(cur_responder_certificate.get(),
                                       issuer_certificate)) {
      continue;
    }

    // If the certificate signed this OCSP response, have found a match.
    // Otherwise keep looking.
    if (VerifyOCSPResponseSignatureGivenCert(response,
                                             cur_responder_certificate.get())) {
      return true;
    }
  }

  // Failed to confirm the validity of the OCSP signature using any of the
  // candidate certificates.
  return false;
}